

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_xonly_pub
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,int *pk_parity,
              secp256k1_keypair *keypair)

{
  int iVar1;
  long in_RCX;
  int *in_RDX;
  void *in_RSI;
  long in_RDI;
  int tmp;
  secp256k1_ge pk;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  secp256k1_ge *in_stack_ffffffffffffff70;
  secp256k1_keypair *in_stack_ffffffffffffff78;
  secp256k1_ge *in_stack_ffffffffffffff80;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_context *in_stack_ffffffffffffff90;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0xee,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RCX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffff70,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_keypair_load
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_extrakeys_ge_even_y(in_stack_ffffffffffffff70);
        if (in_RDX != (int *)0x0) {
          *in_RDX = iVar1;
        }
        secp256k1_xonly_pubkey_save
                  ((secp256k1_xonly_pubkey *)in_stack_ffffffffffffff70,
                   (secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffff68));
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_xonly_pub(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, int *pk_parity, const secp256k1_keypair *keypair) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    if (!secp256k1_keypair_load(ctx, NULL, &pk, keypair)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);

    return 1;
}